

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void display_warning(monst *mon)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  int monflags;
  byte bVar6;
  byte bVar7;
  
  cVar1 = mon->mx;
  cVar2 = mon->my;
  if ((u.uprops[0x18].extrinsic != 0 || u.uprops[0x18].intrinsic != 0) &&
     ((mon->field_0x62 & 0x40) == 0)) {
    bVar7 = mon->m_lev;
    iVar4 = dist2((int)cVar1,(int)cVar2,(int)u.ux,(int)u.uy);
    if (iVar4 < 100) {
      bVar7 = bVar7 >> 2;
      bVar6 = 5;
      if (bVar7 < 5) {
        bVar6 = bVar7;
      }
      uVar5 = (uint)bVar6;
      if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
        if (u.umonnum != u.umonster) {
          bVar3 = dmgtype(youmonst.data,0x24);
          if (bVar3 != '\0') goto LAB_0016b351;
        }
        uVar5 = mt_random();
        uVar5 = uVar5 % 5 + 1;
      }
LAB_0016b351:
      iVar4 = uVar5 + 0x194;
      monflags = 8;
      goto LAB_0016b3d7;
    }
  }
  bVar3 = match_warn_of_mon(mon);
  if (bVar3 == '\0') {
    warning("display_warning did not match warning type?");
    return;
  }
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_0016b3a8:
    iVar4 = (int)mon->mnum;
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar3 = dmgtype(youmonst.data,0x24);
      if (bVar3 != '\0') goto LAB_0016b3a8;
    }
    iVar4 = display_rng(0x193);
  }
  iVar4 = iVar4 + 1;
  monflags = 0;
LAB_0016b3d7:
  dbuf_set(level,(int)cVar1,(int)cVar2,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,iVar4,monflags,0);
  return;
}

Assistant:

static void display_warning(struct monst *mon)
{
    int x = mon->mx, y = mon->my;
    int wl = (int) (mon->m_lev / 4);
    int monnum, mflag;

    if (mon_warning(mon)) {
        if (wl > WARNCOUNT - 1) wl = WARNCOUNT - 1;
	/* 3.4.1: this really ought to be rn2(WARNCOUNT), but value "0"
	   isn't handled correctly by the what_is routine so avoid it */
	if (Hallucination)
	    wl = rn1(WARNCOUNT-1,1);
	monnum = 1 + NUMMONS + wl;
        mflag = MON_WARNING;
    } else if (match_warn_of_mon(mon)) {
	monnum = dbuf_monid(mon);
	mflag = 0;
    } else {
	warning("display_warning did not match warning type?");
	return;
    }

    dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1, 0, monnum, mflag, 0);
}